

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  tree234 *ptr;
  uint uVar2;
  node234_conflict *pnVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int in [60];
  int aiStack_128 [62];
  
  iVar8 = verbose;
  if (1 < argc) {
    uVar6 = 1;
    do {
      pcVar1 = argv[uVar6];
      if (((*pcVar1 != '-') || (pcVar1[1] != 'v')) || (pcVar1[2] != '\0')) {
        fprintf(_stderr,"unrecognised option \'%s\'\n");
        return 1;
      }
      verbose = iVar8 + (int)uVar6;
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  memset(aiStack_128,0,0xf0);
  array = (void **)0x0;
  arraysize = 0;
  arraylen = 0;
  tree = newtree234(mycmp);
  cmp = mycmp;
  verify();
  searchtest();
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (verbose != 0) {
      printf("trial: %d\n",uVar6);
    }
    uVar7 = uVar7 * 0x41c64e6d + 0x3039;
    uVar2 = (uVar7 >> 0x10 & 0x7fff) % 0x3c;
    if (aiStack_128[uVar2] == 0) {
      if (verbose != 0) {
        printf("adding %s (%d)\n",strings[uVar2]);
      }
      addtest(strings[uVar2]);
      iVar8 = 1;
    }
    else {
      if (verbose != 0) {
        printf("deleting %s (%d)\n",strings[uVar2]);
      }
      deltest(strings[uVar2]);
      iVar8 = 0;
    }
    aiStack_128[uVar2] = iVar8;
    findtest();
    searchtest();
    uVar2 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar2;
  } while (uVar2 != 10000);
  while (ptr = tree, 0 < arraylen) {
    uVar7 = uVar7 * 0x41c64e6d + 0x3039;
    deltest(array[(ulong)(uVar7 >> 0x10 & 0x7fff) % (ulong)(uint)arraylen]);
  }
  freenode234(tree->root);
  safefree(ptr);
  tree = newtree234((cmpfn234)0x0);
  cmp = (cmpfn234)0x0;
  verify();
  uVar2 = 0;
  do {
    if (verbose != 0) {
      printf("trial: %d\n",(ulong)uVar2);
    }
    pnVar3 = tree->root;
    if (pnVar3 == (node234_conflict *)0x0) {
      iVar8 = 1;
    }
    else {
      iVar8 = pnVar3->counts[3] + pnVar3->counts[1] + pnVar3->counts[2] + pnVar3->counts[0];
      lVar4 = 0;
      do {
        iVar8 = (iVar8 + 1) - (uint)(pnVar3->elems[lVar4] == (void *)0x0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      iVar8 = iVar8 + 1;
    }
    uVar5 = (uVar7 * 0x41c64e6d + 0x3039 >> 0x10 & 0x7fff) % 0x3c;
    uVar7 = uVar7 * -0x3d5d6597 + 0xd3dc167e;
    uVar6 = (long)(ulong)(uVar7 >> 0x10 & 0x7fff) % (long)iVar8;
    if (verbose != 0) {
      printf("adding string %s at index %d\n",strings[uVar5],uVar6 & 0xffffffff);
    }
    addpostest(strings[uVar5],(int)uVar6);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 1000);
  pnVar3 = tree->root;
  while (pnVar3 != (node234_conflict *)0x0) {
    iVar8 = pnVar3->counts[3] + pnVar3->counts[1] + pnVar3->counts[2] + pnVar3->counts[0];
    lVar4 = 7;
    do {
      iVar8 = (iVar8 + 1) - (uint)(pnVar3->kids[lVar4 + -1] == (node234 *)0x0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    if (iVar8 < 1) break;
    if (verbose == 0) {
      uVar7 = uVar7 * 0x41c64e6d + 0x3039;
      uVar2 = uVar7 >> 0x10 & 0x7fff;
LAB_00103bd9:
      iVar8 = pnVar3->counts[3] + pnVar3->counts[1] + pnVar3->counts[2] + pnVar3->counts[0];
      lVar4 = 0;
      do {
        iVar8 = (iVar8 + 1) - (uint)(pnVar3->elems[lVar4] == (void *)0x0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else {
      uVar6 = (ulong)(uint)(pnVar3->counts[3] + pnVar3->counts[1] +
                           pnVar3->counts[2] + pnVar3->counts[0]);
      lVar4 = 0;
      do {
        uVar6 = (ulong)(((int)uVar6 + 1) - (uint)(pnVar3->elems[lVar4] == (void *)0x0));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      iVar8 = 0;
      printf("cleanup: tree size %d\n",uVar6);
      pnVar3 = tree->root;
      uVar7 = uVar7 * 0x41c64e6d + 0x3039;
      uVar2 = uVar7 >> 0x10 & 0x7fff;
      if (pnVar3 != (node234_conflict *)0x0) goto LAB_00103bd9;
    }
    uVar6 = (long)(ulong)uVar2 % (long)iVar8;
    if (verbose != 0) {
      printf("deleting string %s from index %d\n",array[uVar6 & 0xffffffff],uVar6 & 0xffffffff);
    }
    delpostest((int)uVar6);
    pnVar3 = tree->root;
  }
  printf("%d errors found\n",(ulong)(uint)n_errors);
  return (uint)(n_errors != 0);
}

Assistant:

int main(int argc, char **argv)
{
    int in[NSTR];
    int i, j, k;
    unsigned seed = 0;

    for (i = 1; i < argc; i++) {
        char *arg = argv[i];
        if (!strcmp(arg, "-v")) {
            verbose++;
        } else {
            fprintf(stderr, "unrecognised option '%s'\n", arg);
            return 1;
        }
    }

    for (i = 0; i < NSTR; i++)
        in[i] = 0;
    array = NULL;
    arraylen = arraysize = 0;
    tree = newtree234(mycmp);
    cmp = mycmp;

    verify();
    searchtest();
    for (i = 0; i < 10000; i++) {
        j = randomnumber(&seed);
        j %= NSTR;
        if (verbose)
            printf("trial: %d\n", i);
        if (in[j]) {
            if (verbose)
                printf("deleting %s (%d)\n", strings[j], j);
            deltest(strings[j]);
            in[j] = 0;
        } else {
            if (verbose)
                printf("adding %s (%d)\n", strings[j], j);
            addtest(strings[j]);
            in[j] = 1;
        }
        findtest();
        searchtest();
    }

    while (arraylen > 0) {
        j = randomnumber(&seed);
        j %= arraylen;
        deltest(array[j]);
    }

    freetree234(tree);

    /*
     * Now try an unsorted tree. We don't really need to test
     * delpos234 because we know del234 is based on it, so it's
     * already been tested in the above sorted-tree code; but for
     * completeness we'll use it to tear down our unsorted tree
     * once we've built it.
     */
    tree = newtree234(NULL);
    cmp = NULL;
    verify();
    for (i = 0; i < 1000; i++) {
        if (verbose)
            printf("trial: %d\n", i);
        j = randomnumber(&seed);
        j %= NSTR;
        k = randomnumber(&seed);
        k %= count234(tree) + 1;
        if (verbose)
            printf("adding string %s at index %d\n", strings[j], k);
        addpostest(strings[j], k);
    }
    while (count234(tree) > 0) {
        if (verbose)
            printf("cleanup: tree size %d\n", count234(tree));
        j = randomnumber(&seed);
        j %= count234(tree);
        if (verbose)
            printf("deleting string %s from index %d\n",
                   (const char *)array[j], j);
        delpostest(j);
    }

    printf("%d errors found\n", n_errors);
    return (n_errors != 0);
}